

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O3

ParserString
GeneratedSaxParser::Utils::toStringListItem(ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  ParserString PVar7;
  
  pbVar6 = (byte *)*buffer;
  if ((pbVar6 == (byte *)0x0) || (pbVar6 == (byte *)bufferEnd)) {
    *failed = true;
    pbVar4 = (byte *)0x0;
    sVar5 = 0;
    goto LAB_0080a7ca;
  }
  do {
    if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) {
      if (pbVar6 == (byte *)bufferEnd) goto LAB_0080a83b;
      bVar2 = false;
      sVar5 = 0;
      pbVar4 = (byte *)0x0;
      goto LAB_0080a7e0;
    }
    pbVar6 = pbVar6 + 1;
  } while (pbVar6 != (byte *)bufferEnd);
  *failed = true;
  *buffer = bufferEnd;
  goto LAB_0080a7ba;
  while( true ) {
    if (!bVar2) {
      bVar2 = true;
      pbVar4 = pbVar1;
    }
    lVar3 = sVar5 + 1;
    sVar5 = sVar5 + 1;
    if (pbVar6 + lVar3 == (byte *)bufferEnd) break;
LAB_0080a7e0:
    pbVar1 = pbVar6 + sVar5;
    if (((ulong)pbVar6[sVar5] < 0x21) && ((0x100002600U >> ((ulong)pbVar6[sVar5] & 0x3f) & 1) != 0))
    {
      if (bVar2) {
        *buffer = (ParserChar *)pbVar1;
        *failed = false;
        goto LAB_0080a7ca;
      }
      *failed = true;
      *buffer = (ParserChar *)pbVar1;
      goto LAB_0080a7ba;
    }
  }
  pbVar6 = (byte *)bufferEnd;
  if (bVar2) {
    *failed = false;
    *buffer = bufferEnd;
    goto LAB_0080a7ca;
  }
LAB_0080a83b:
  *failed = true;
  *buffer = (ParserChar *)pbVar6;
LAB_0080a7ba:
  pbVar4 = (byte *)0x0;
  sVar5 = 0;
LAB_0080a7ca:
  PVar7.super_UnionString.length = sVar5;
  PVar7.super_UnionString.str = (ParserChar *)pbVar4;
  return (ParserString)PVar7.super_UnionString;
}

Assistant:

ParserString Utils::toStringListItem(const ParserChar** buffer, const ParserChar* bufferEnd, bool& failed)
    {
        ParserString value;

        const ParserChar* s = *buffer;
        if ( !s )
        {
            failed = true;
            return value;
        }

        if ( s == bufferEnd )
        {
            failed = true;
            *buffer = bufferEnd;
            return value;
        }

        // Skip leading white spaces
        while ( isWhiteSpace(*s) )
        {
            ++s;
            if ( s == bufferEnd )
            {
                failed = true;
                *buffer = bufferEnd;
                return value;
            }
        }

        bool characterFound = false;
        while (true)
        {
            if ( s == bufferEnd )
            {
                if (characterFound)
                {
                    failed = false;
                    *buffer = s;
                    return value;
                }
                else
                {
                    failed = true;
                    *buffer = s;
                    value.str = 0;
                    value.length = 0;
                    return value;
                }
            }

            if ( !isWhiteSpace(*s) )
            {
                if (!characterFound)
                {
                    value.str = s;
                    characterFound = true;
                }
                value.length++;
            }
            else
                break;
            ++s;
        }
        if ( characterFound )
        {
            *buffer = s;
            failed = false;
            return value;
        }
        else
        {
            failed = true;
            *buffer = s;
            value.str = 0;
            value.length = 0;
            return value;
        }
    }